

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void alphargbblend_generic
               (uint coverage,QRgba64 *dest,int x,QRgba64 *srcLinear,QRgba64 *src,
               QColorTrcLut *colorProfile)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  QRgba64 *in_R8;
  QColorTrcLut *in_R9;
  long in_FS_OFFSET;
  QRgba64 s;
  QRgba64 in_stack_000000b8;
  QColorTrcLut *in_stack_ffffffffffffff88;
  int x_00;
  undefined4 in_stack_ffffffffffffffa8;
  QRgba64 in_stack_ffffffffffffffd8;
  QRgba64 slinear;
  QRgba64 *in_stack_ffffffffffffffe0;
  
  x_00 = (int)((ulong)in_RCX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDI != -0x1000000) {
    if (in_EDI == -1) {
      blend_pixel(in_stack_ffffffffffffffe0,in_stack_000000b8);
    }
    else {
      bVar2 = QRgba64::isOpaque((QRgba64 *)(in_RSI + (long)in_EDX * 8));
      if (bVar2) {
        bVar2 = QRgba64::isOpaque(in_R8);
        if (bVar2) {
          rgbBlendPixel(in_R8,(int)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffd8,
                        in_stack_ffffffffffffff88);
        }
        else {
          slinear.rgba = in_R8->rgba;
          blend_pixel(*(QRgba64 **)(in_RSI + (long)in_EDX * 8),in_stack_000000b8);
          if (in_R9 != (QColorTrcLut *)0x0) {
            QColorTrcLut::toLinear(in_R9,in_stack_000000b8);
          }
          rgbBlendPixel(in_R8,(int)((ulong)in_R9 >> 0x20),slinear,in_stack_ffffffffffffff88);
        }
      }
      else {
        qRgbAvg((QRgb)((ulong)in_R9 >> 0x20));
        alphamapblend_generic
                  ((int)((ulong)in_RSI >> 0x20),
                   (QRgba64 *)CONCAT44(in_EDX,in_stack_ffffffffffffffa8),x_00,in_R8,(QRgba64 *)in_R9
                   ,in_stack_ffffffffffffff88);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void alphargbblend_generic(uint coverage, QRgba64 *dest, int x, const QRgba64 &srcLinear, const QRgba64 &src, const QColorTrcLut *colorProfile)
{
    if (coverage == 0xff000000) {
        // nothing
    } else if (coverage == 0xffffffff) {
        blend_pixel(dest[x], src);
    } else if (!dest[x].isOpaque()) {
        // Do a gray alphablend.
        alphamapblend_generic(qRgbAvg(coverage), dest, x, srcLinear, src, colorProfile);
    } else if (src.isOpaque()) {
        rgbBlendPixel(dest[x], coverage, srcLinear, colorProfile);
    } else {
        // First do naive blend with text-color
        QRgba64 s = dest[x];
        blend_pixel(s, src);
        // Then gamma-corrected blend with glyph shape
        if (colorProfile)
            s = colorProfile->toLinear(s);
        rgbBlendPixel(dest[x], coverage, s, colorProfile);
    }
}